

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O1

HTS_Boolean
HTS_Model_load(HTS_Model *model,HTS_File *pdf,HTS_File *tree,size_t vector_length,size_t num_windows
              ,HTS_Boolean is_msd)

{
  size_t *psVar1;
  HTS_Question **ppHVar2;
  HTS_Question *pHVar3;
  size_t *psVar4;
  bool bVar5;
  HTS_Boolean HVar6;
  int iVar7;
  uint uVar8;
  void *pvVar9;
  size_t sVar10;
  HTS_Node *tree_00;
  char *pcVar11;
  char *pcVar12;
  HTS_Pattern *pHVar13;
  _HTS_Node *p_Var14;
  _HTS_Node *p_Var15;
  _HTS_Tree **pp_Var16;
  float **ppfVar17;
  float *pfVar18;
  size_t sVar19;
  HTS_Node **ppHVar20;
  _HTS_Node *p_Var21;
  ulong uVar22;
  HTS_Pattern *pHVar23;
  HTS_Tree *pHVar24;
  HTS_Question *pHVar25;
  ulong uVar26;
  HTS_Tree *local_878;
  HTS_Tree *local_870;
  uint local_838 [256];
  undefined4 local_438;
  
  if ((num_windows == 0 || vector_length == 0) ||
      (pdf == (HTS_File *)0x0 || model == (HTS_Model *)0x0)) {
    return '\0';
  }
  HTS_Model_clear(model);
  if (tree != (HTS_File *)0x0) {
    model->ntree = 0;
    iVar7 = HTS_feof(tree);
    if (iVar7 == 0) {
      ppHVar2 = &model->question;
      local_870 = (HTS_Tree *)0x0;
      local_878 = (HTS_Tree *)0x0;
      do {
        HTS_get_pattern_token(tree,(char *)&local_438);
        if (local_438._2_1_ == '\0' && (short)local_438 == 0x5351) {
          tree_00 = (HTS_Node *)HTS_calloc(1,0x18);
          *(undefined8 *)tree_00 = 0;
          tree_00->pdf = 0;
          tree_00->yes = (_HTS_Node *)0x0;
          HVar6 = HTS_Question_load((HTS_Question *)tree_00,tree);
          if (HVar6 != '\0') {
            ppHVar20 = &local_878->root;
            if (*ppHVar2 == (HTS_Question *)0x0) {
              ppHVar20 = (HTS_Node **)ppHVar2;
            }
            *ppHVar20 = tree_00;
            tree_00->yes = (_HTS_Node *)0x0;
            local_878 = (HTS_Tree *)tree_00;
            goto LAB_001552d4;
          }
LAB_0015581d:
          free(tree_00);
          goto LAB_00155825;
        }
LAB_001552d4:
        pcVar11 = strchr((char *)&local_438,0x5b);
        if (pcVar11 == (char *)0x0) {
LAB_0015530b:
          sVar10 = 0;
        }
        else {
          pcVar12 = strchr(pcVar11 + 1,0x5d);
          if (pcVar12 == (char *)0x0) goto LAB_0015530b;
          iVar7 = atoi(pcVar11 + 1);
          sVar10 = (size_t)iVar7;
        }
        if (sVar10 != 0) {
          tree_00 = (HTS_Node *)HTS_calloc(1,0x20);
          ((HTS_Tree *)tree_00)->root = (HTS_Node *)0x0;
          ((HTS_Tree *)tree_00)->state = 0;
          ((HTS_Tree *)tree_00)->head = (HTS_Pattern *)0x0;
          ((HTS_Tree *)tree_00)->next = (_HTS_Tree *)0x0;
          ((HTS_Tree *)tree_00)->state = sVar10;
          ((HTS_Tree *)tree_00)->head = (HTS_Pattern *)0x0;
          pcVar11 = strchr((char *)&local_438,0x7b);
          if (pcVar11 != (char *)0x0) {
            pcVar12 = pcVar11 + 2;
            if (pcVar11[1] != '(') {
              pcVar12 = pcVar11 + 1;
            }
            pcVar11 = strrchr(pcVar12,0x7d);
            if ((pcVar12 < pcVar11) && (pcVar11[-1] == ')')) {
              pcVar11 = pcVar11 + -1;
            }
            *pcVar11 = ',';
            pcVar11 = strchr(pcVar12,0x2c);
            if (pcVar11 != (char *)0x0) {
              pHVar23 = (HTS_Pattern *)0x0;
              do {
                pHVar13 = (HTS_Pattern *)HTS_calloc(1,0x10);
                pHVar24 = (HTS_Tree *)&pHVar23->next;
                if (((HTS_Tree *)tree_00)->head == (HTS_Pattern *)0x0) {
                  pHVar24 = (HTS_Tree *)tree_00;
                }
                pHVar24->head = pHVar13;
                *pcVar11 = '\0';
                pcVar12 = HTS_strdup(pcVar12);
                pHVar13->string = pcVar12;
                pcVar12 = pcVar11 + 1;
                pHVar13->next = (_HTS_Pattern *)0x0;
                pcVar11 = strchr(pcVar12,0x2c);
                pHVar23 = pHVar13;
              } while (pcVar11 != (char *)0x0);
            }
          }
          pHVar3 = *ppHVar2;
          HVar6 = HTS_get_pattern_token(tree,(char *)local_838);
          if (HVar6 == '\0') {
LAB_00155815:
            HTS_Tree_clear((HTS_Tree *)tree_00);
            goto LAB_0015581d;
          }
          p_Var14 = (_HTS_Node *)HTS_calloc(1,0x30);
          p_Var14->index = 0;
          p_Var14->pdf = 0;
          p_Var14->yes = (_HTS_Node *)0x0;
          p_Var14->no = (_HTS_Node *)0x0;
          p_Var14->next = (_HTS_Node *)0x0;
          p_Var14->quest = (HTS_Question *)0x0;
          ((HTS_Tree *)tree_00)->root = p_Var14;
          if ((short)local_838[0] == 0x7b) {
            HVar6 = HTS_get_pattern_token(tree,(char *)local_838);
            if (HVar6 == '\x01') {
              while ((short)local_838[0] != 0x7d) {
                uVar8 = atoi((char *)local_838);
                for (p_Var21 = p_Var14; p_Var21 != (HTS_Node *)0x0; p_Var21 = p_Var21->next) {
                  if (p_Var21->index == uVar8) goto LAB_0015549c;
                }
                p_Var21 = (HTS_Node *)0x0;
LAB_0015549c:
                if (p_Var21 == (HTS_Node *)0x0) {
                  HTS_error(0,"HTS_Tree_load: Cannot find node %d.\n",(ulong)uVar8);
                  goto LAB_00155815;
                }
                HVar6 = HTS_get_pattern_token(tree,(char *)local_838);
                pHVar25 = pHVar3;
                if (HVar6 == '\0') goto LAB_00155815;
                for (; pHVar25 != (HTS_Question *)0x0; pHVar25 = pHVar25->next) {
                  iVar7 = strcmp((char *)local_838,pHVar25->string);
                  if (iVar7 == 0) goto LAB_001554df;
                }
                pHVar25 = (HTS_Question *)0x0;
LAB_001554df:
                p_Var21->quest = pHVar25;
                if (pHVar25 == (HTS_Question *)0x0) {
                  HTS_error(0,"HTS_Tree_load: Cannot find question %s.\n",local_838);
                  goto LAB_00155815;
                }
                p_Var15 = (_HTS_Node *)HTS_calloc(1,0x30);
                p_Var21->yes = p_Var15;
                p_Var15 = (_HTS_Node *)HTS_calloc(1,0x30);
                p_Var21->no = p_Var15;
                p_Var15 = p_Var21->yes;
                p_Var15->index = 0;
                p_Var15->pdf = 0;
                p_Var15->yes = (_HTS_Node *)0x0;
                p_Var15->no = (_HTS_Node *)0x0;
                p_Var15->next = (_HTS_Node *)0x0;
                p_Var15->quest = (HTS_Question *)0x0;
                p_Var15 = p_Var21->no;
                p_Var15->index = 0;
                p_Var15->quest = (HTS_Question *)0x0;
                p_Var15->no = (_HTS_Node *)0x0;
                p_Var15->next = (_HTS_Node *)0x0;
                p_Var15->pdf = 0;
                p_Var15->yes = (_HTS_Node *)0x0;
                HVar6 = HTS_get_pattern_token(tree,(char *)local_838);
                if (HVar6 == '\0') {
LAB_001557d0:
                  p_Var21->quest = (HTS_Question *)0x0;
                  free(p_Var21->yes);
                  free(p_Var21->no);
                  goto LAB_00155815;
                }
                HVar6 = HTS_is_num((char *)local_838);
                if (HVar6 == '\0') {
                  sVar10 = HTS_name2num((char *)local_838);
                  p_Var21->no->pdf = sVar10;
                }
                else {
                  iVar7 = atoi((char *)local_838);
                  p_Var21->no->index = iVar7;
                }
                p_Var15 = p_Var21->no;
                p_Var15->next = p_Var14;
                HVar6 = HTS_get_pattern_token(tree,(char *)local_838);
                if (HVar6 == '\0') goto LAB_001557d0;
                HVar6 = HTS_is_num((char *)local_838);
                if (HVar6 == '\0') {
                  sVar10 = HTS_name2num((char *)local_838);
                  p_Var21->yes->pdf = sVar10;
                }
                else {
                  iVar7 = atoi((char *)local_838);
                  p_Var21->yes->index = iVar7;
                }
                p_Var14 = p_Var21->yes;
                p_Var14->next = p_Var15;
                HVar6 = HTS_get_pattern_token(tree,(char *)local_838);
                if (HVar6 != '\x01') break;
              }
            }
          }
          else {
            sVar10 = HTS_name2num((char *)local_838);
            p_Var14->pdf = sVar10;
          }
          pp_Var16 = &local_870->next;
          if (model->tree == (HTS_Tree *)0x0) {
            pp_Var16 = &model->tree;
          }
          *pp_Var16 = (_HTS_Tree *)tree_00;
          ((HTS_Tree *)tree_00)->next = (_HTS_Tree *)0x0;
          model->ntree = model->ntree + 1;
          local_870 = (HTS_Tree *)tree_00;
        }
        iVar7 = HTS_feof(tree);
      } while (iVar7 == 0);
    }
    if (model->tree != (HTS_Tree *)0x0) goto LAB_0015516e;
  }
  model->ntree = 1;
LAB_0015516e:
  if (model->ntree == 0) {
    HTS_error(1,"HTS_Model_load_pdf: File for pdfs is not specified.\n");
  }
  else {
    psVar1 = &model->ntree;
    model->vector_length = vector_length;
    model->num_windows = num_windows;
    model->is_msd = is_msd;
    pvVar9 = HTS_calloc(model->ntree,8);
    model->npdf = (size_t *)((long)pvVar9 + -0x10);
    bVar5 = true;
    if (1 < model->ntree + 1) {
      uVar22 = 2;
      do {
        sVar10 = HTS_fread_little_endian(local_838,4,1,pdf);
        if (sVar10 != 1) {
          bVar5 = false;
          break;
        }
        model->npdf[uVar22] = (ulong)local_838[0];
        uVar22 = uVar22 + 1;
      } while (uVar22 <= model->ntree + 1);
    }
    if (1 < *psVar1 + 1) {
      uVar22 = 2;
      do {
        if (model->npdf[uVar22] == 0) {
          bVar5 = false;
          HTS_error(1,"HTS_Model_load_pdf: # of pdfs at %d-th state should be positive.\n");
          break;
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 <= *psVar1 + 1);
    }
    if (bVar5) {
      pvVar9 = HTS_calloc(model->ntree,8);
      model->pdf = (float ***)((long)pvVar9 + -0x10);
      if (model->ntree + 1 < 2) {
        return '\x01';
      }
      sVar10 = (ulong)(is_msd != '\0') + model->vector_length * model->num_windows * 2;
      uVar22 = 2;
      do {
        ppfVar17 = (float **)HTS_calloc(model->npdf[uVar22],8);
        model->pdf[uVar22] = ppfVar17;
        model->pdf[uVar22] = model->pdf[uVar22] + -1;
        if (model->npdf[uVar22] != 0) {
          uVar26 = 1;
          do {
            pfVar18 = (float *)HTS_calloc(sVar10,4);
            model->pdf[uVar22][uVar26] = pfVar18;
            sVar19 = HTS_fread_little_endian(model->pdf[uVar22][uVar26],4,sVar10,pdf);
            if (sVar19 != sVar10) {
              bVar5 = false;
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 <= model->npdf[uVar22]);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 <= *psVar1 + 1);
      if (bVar5) {
        return '\x01';
      }
LAB_00155825:
      HTS_Model_clear(model);
    }
    else {
      psVar4 = model->npdf;
      model->npdf = psVar4 + 2;
      free(psVar4 + 2);
      model->vector_length = 0;
      model->num_windows = 0;
      model->is_msd = '\0';
      model->pdf = (float ***)0x0;
      model->tree = (HTS_Tree *)0x0;
      *psVar1 = 0;
      model->npdf = (size_t *)0x0;
      model->question = (HTS_Question *)0x0;
    }
  }
  HTS_Model_clear(model);
  return '\0';
}

Assistant:

static HTS_Boolean HTS_Model_load(HTS_Model * model, HTS_File * pdf, HTS_File * tree, size_t vector_length, size_t num_windows, HTS_Boolean is_msd)
{
   /* check */
   if (model == NULL || pdf == NULL || vector_length == 0 || num_windows == 0)
      return FALSE;

   /* reset */
   HTS_Model_clear(model);

   /* load tree */
   if (HTS_Model_load_tree(model, tree) != TRUE) {
      HTS_Model_clear(model);
      return FALSE;
   }

   /* load pdf */
   if (HTS_Model_load_pdf(model, pdf, vector_length, num_windows, is_msd) != TRUE) {
      HTS_Model_clear(model);
      return FALSE;
   }

   return TRUE;
}